

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O2

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  bool bVar1;
  Value *this;
  ostream *poVar2;
  pointer pbVar3;
  const_iterator cVar4;
  signalReferences_t signalReferences;
  signalReferences_t local_78;
  string local_58;
  ValueIteratorBase local_38;
  
  bVar1 = std::operator==(method,"available");
  if (bVar1) {
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar4 = Json::Value::begin(params);
    local_38.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_38.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar4 = Json::Value::end(params);
      local_58._M_dataplus._M_p = (pointer)cVar4.super_ValueIteratorBase.current_._M_node;
      local_58._M_string_length._0_1_ = cVar4.super_ValueIteratorBase.isNull_;
      bVar1 = Json::ValueIteratorBase::operator!=(&local_38,(SelfType *)&local_58);
      if (!bVar1) break;
      this = Json::ValueIteratorBase::deref(&local_38);
      Json::Value::asString_abi_cxx11_(&local_58,this);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 &local_58);
      std::__cxx11::string::~string((string *)&local_58);
      Json::ValueIteratorBase::increment(&local_38);
    }
    hbm::streaming::StreamClient::subscribe(stream,&local_78);
    poVar2 = std::operator<<((ostream *)&std::cout,"streamMetaInformationCb");
    std::operator<<(poVar2,"the following signal(s) were subscribed: ");
    for (pbVar3 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\'");
      poVar2 = std::operator<<(poVar2,(string *)pbVar3);
      std::operator<<(poVar2,"\' ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	if (method==hbm::streaming::META_METHOD_AVAILABLE) {
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			signalReferences.push_back(element.asString());
		}

		try {
			stream.subscribe(signalReferences);
			std::cout << __FUNCTION__ << "the following signal(s) were subscribed: ";
		} catch(const std::runtime_error& e) {
			std::cerr << __FUNCTION__ << "error '" << e.what() << "' subscribing the following signal(s): ";
		}

		for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
			std::cout << "'" << *iter << "' ";
		}
		std::cout << std::endl;
	}
}